

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastMtS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  MessageLite *pMVar5;
  ulong uVar6;
  char *pcVar7;
  Nonnull<const_char_*> failure_msg;
  uint *puVar8;
  Arena *arena;
  ErrnoSaver unaff_R12D;
  TcParseTableBase *unaff_R13;
  long *plVar9;
  ushort *puVar10;
  pair<const_char_*,_int> pVar11;
  MessageLite *unaff_retaddr;
  ErrnoSaver local_48;
  char *local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar8 & 3) != 0) {
      AlignFail(puVar8);
    }
    *puVar8 = *puVar8 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar9 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar9 & 7) != 0) {
    AlignFail(plVar9);
  }
  lVar1 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  if (*plVar9 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar5 = ClassData::New(*(ClassData **)(lVar1 + 0x20),arena);
    *plVar9 = (long)pMVar5;
  }
  if (ptr[1] < '\0') {
    pVar11 = ReadSizeFallback(ptr + 1,(uint)(byte)ptr[1]);
    puVar10 = (ushort *)pVar11.first;
  }
  else {
    puVar10 = (ushort *)(ptr + 2);
  }
  if ((puVar10 == (ushort *)0x0) || (ctx->depth_ < 1)) {
    puVar10 = (ushort *)0x0;
  }
  else {
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&stack0xffffffffffffffb8,(char *)ctx,(int)puVar10);
    ctx->depth_ = ctx->depth_ + -1;
    unaff_R12D.saved_errno_ = local_48.saved_errno_;
  }
  if (puVar10 != (ushort *)0x0) {
    local_38 = (char *)(long)ctx->depth_;
    lVar2 = *plVar9;
    _local_48 = puVar10;
    while (bVar3 = EpsCopyInputStream::DoneWithCheck<false>
                             (&ctx->super_EpsCopyInputStream,(char **)&stack0xffffffffffffffb8,
                              ctx->group_depth_), !bVar3) {
      uVar4 = (uint)*(byte *)(lVar1 + 8) & (uint)*_local_48;
      if ((uVar4 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar6 = (ulong)(uVar4 & 0xfffffff8);
      _local_48 = (ushort *)
                  (**(code **)(lVar1 + 0x38 + uVar6 * 2))
                            (lVar2,_local_48,ctx,
                             (ulong)*_local_48 ^ *(ulong *)(lVar1 + 0x40 + uVar6 * 2),lVar1,0);
      if ((_local_48 == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
      break;
    }
    if ((*(byte *)(lVar1 + 9) & 1) == 0) {
      puVar10 = _local_48;
      if (_local_48 == (ushort *)0x0) {
        VerifyHasBitConsistency(unaff_retaddr,unaff_R13);
        puVar10 = _local_48;
      }
    }
    else {
      puVar10 = (ushort *)(**(code **)(lVar1 + 0x28))(lVar2,_local_48,ctx);
    }
    if (puVar10 != (ushort *)0x0) {
      if ((int)local_38 == ctx->depth_) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                ((long)local_38,(long)ctx->depth_,"old_depth == depth_");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffb8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x481,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&stack0xffffffffffffffb8);
      }
    }
    ctx->depth_ = ctx->depth_ + 1;
    uVar4 = unaff_R12D.saved_errno_ + (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar4;
    if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ == 0) {
      (ctx->super_EpsCopyInputStream).limit_end_ =
           (ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4);
      return (char *)puVar10;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}